

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O3

IRIns * lj_snap_regspmap(jit_State *J,GCtrace *T,SnapNo snapno,IRIns *ir)

{
  byte *pbVar1;
  char *pcVar2;
  uint uVar3;
  SnapEntry *pSVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  IRIns *pIVar9;
  IRRef1 IVar10;
  
  uVar3 = T->snap[snapno].mapofs;
  uVar7 = (ulong)(T->nins - 1);
  uVar6 = 0;
  if (*(char *)((long)T->ir + uVar7 * 8 + 5) == '\x14') {
    pIVar9 = T->ir + uVar7;
    uVar7 = 0;
    do {
      if ((pIVar9->field_0).op2 <= snapno) {
        uVar7 = uVar7 | 1L << ((ulong)*(byte *)pIVar9 & 0x3f);
      }
      pbVar1 = (byte *)((long)pIVar9 + -3);
      pIVar9 = pIVar9 + -1;
    } while (*pbVar1 == 0x14);
  }
  else {
    uVar7 = 0;
  }
  pSVar4 = T->snapmap;
  do {
    if ((ir->field_1).o == '\x0e') {
      uVar8 = (ir->field_0).op1 + 0x8000;
    }
    else {
      if (((ir->field_1).o != 'F') || (((ir->field_0).op2 & 1) == 0)) {
        return ir;
      }
      do {
        uVar5 = (ulong)uVar6;
        uVar6 = uVar6 + 1;
      } while (pSVar4[uVar3 + uVar5] >> 0x18 != (uint)(ir->field_0).op1);
      uVar8 = pSVar4[uVar3 + uVar5] & 0xffff;
    }
    pIVar9 = T->ir;
    IVar10 = *(IRRef1 *)((long)pIVar9 + (ulong)uVar8 * 8 + 6);
    if (((uVar7 >> ((ulong)uVar8 & 0x3f) & 1) != 0) &&
       (uVar5 = (ulong)(T->nins - 1), *(char *)((long)pIVar9 + uVar5 * 8 + 5) == '\x14')) {
      pIVar9 = pIVar9 + uVar5;
      do {
        if ((uVar8 == (pIVar9->field_0).op1) && ((pIVar9->field_0).op2 <= snapno)) {
          IVar10 = (pIVar9->field_0).prev;
        }
        pcVar2 = (char *)((long)pIVar9 + -3);
        pIVar9 = pIVar9 + -1;
      } while (*pcVar2 == '\x14');
    }
    (ir->field_0).prev = IVar10;
    ir = ir + 1;
  } while( true );
}

Assistant:

IRIns *lj_snap_regspmap(jit_State *J, GCtrace *T, SnapNo snapno, IRIns *ir)
{
  SnapShot *snap = &T->snap[snapno];
  SnapEntry *map = &T->snapmap[snap->mapofs];
  BloomFilter rfilt = snap_renamefilter(T, snapno);
  MSize n = 0;
  IRRef ref = 0;
  UNUSED(J);
  for ( ; ; ir++) {
    uint32_t rs;
    if (ir->o == IR_SLOAD) {
      if (!(ir->op2 & IRSLOAD_PARENT)) break;
      for ( ; ; n++) {
	lj_assertJ(n < snap->nent, "slot %d not found in snapshot", ir->op1);
	if (snap_slot(map[n]) == ir->op1) {
	  ref = snap_ref(map[n++]);
	  break;
	}
      }
    } else if (LJ_SOFTFP32 && ir->o == IR_HIOP) {
      ref++;
    } else if (ir->o == IR_PVAL) {
      ref = ir->op1 + REF_BIAS;
    } else {
      break;
    }
    rs = T->ir[ref].prev;
    if (bloomtest(rfilt, ref))
      rs = snap_renameref(T, snapno, ref, rs);
    ir->prev = (uint16_t)rs;
    lj_assertJ(regsp_used(rs), "unused IR %04d in snapshot", ref - REF_BIAS);
  }
  return ir;
}